

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

bool absl::anon_unknown_0::SafeAddRepHi(double a_hi,double b_hi,Duration *d)

{
  double dVar1;
  uint32_t lo;
  undefined8 in_RDX;
  Duration DVar2;
  Duration d_00;
  double c;
  Duration *d_local;
  double b_hi_local;
  double a_hi_local;
  
  dVar1 = a_hi + b_hi;
  if (dVar1 < 9.223372036854776e+18) {
    if (-9.223372036854776e+18 < dVar1) {
      DVar2.rep_hi_ = *(ulong *)&d->rep_lo_ & 0xffffffff;
      DVar2._8_8_ = in_RDX;
      lo = time_internal::GetRepLo((time_internal *)d->rep_hi_,DVar2);
      DVar2 = time_internal::MakeDuration((long)dVar1,lo);
      d->rep_hi_ = DVar2.rep_hi_;
      d->rep_lo_ = DVar2.rep_lo_;
      a_hi_local._7_1_ = true;
    }
    else {
      DVar2 = InfiniteDuration();
      d_00._12_4_ = 0;
      d_00.rep_hi_ = SUB128(DVar2._0_12_,0);
      d_00.rep_lo_ = SUB124(DVar2._0_12_,8);
      DVar2 = absl::operator-(d_00);
      d->rep_hi_ = DVar2.rep_hi_;
      d->rep_lo_ = DVar2.rep_lo_;
      a_hi_local._7_1_ = false;
    }
  }
  else {
    DVar2 = InfiniteDuration();
    d->rep_hi_ = DVar2.rep_hi_;
    d->rep_lo_ = DVar2.rep_lo_;
    a_hi_local._7_1_ = false;
  }
  return a_hi_local._7_1_;
}

Assistant:

inline bool SafeAddRepHi(double a_hi, double b_hi, Duration* d) {
  double c = a_hi + b_hi;
  if (c >= static_cast<double>(kint64max)) {
    *d = InfiniteDuration();
    return false;
  }
  if (c <= static_cast<double>(kint64min)) {
    *d = -InfiniteDuration();
    return false;
  }
  *d = time_internal::MakeDuration(c, time_internal::GetRepLo(*d));
  return true;
}